

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# RecyclerWeakReference.h
# Opt level: O1

void __thiscall
Memory::WeakReferenceHashTable<PrimePolicy>::Resize
          (WeakReferenceHashTable<PrimePolicy> *this,int newSize)

{
  Type pRVar1;
  code *pcVar2;
  RecyclerWeakReferenceBase *pRVar3;
  bool bVar4;
  BOOL BVar5;
  hash_t hVar6;
  HeapAllocator *this_00;
  undefined4 *puVar7;
  RecyclerWeakReferenceBase **__s;
  size_t sVar8;
  ulong uVar9;
  uint uVar10;
  undefined1 local_68 [8];
  TrackAllocData data;
  
  local_68 = (undefined1  [8])&RecyclerWeakReferenceBase*::typeinfo;
  data.typeinfo = (type_info *)0x0;
  data.count = (size_t)anon_var_dwarf_190d19;
  data.filename._0_4_ = 0x137;
  data.plusSize = (long)newSize;
  this_00 = HeapAllocator::TrackAllocInfo(this->allocator,(TrackAllocData *)local_68);
  sVar8 = 0xffffffffffffffff;
  if (-1 < newSize) {
    sVar8 = (long)newSize * 8;
  }
  BVar5 = ExceptionCheck::CanHandleOutOfMemory();
  if (BVar5 == 0) {
    AssertCount = AssertCount + 1;
    Js::Throw::LogAssert();
    puVar7 = (undefined4 *)__tls_get_addr(&PTR_0155fe48);
    *puVar7 = 1;
    bVar4 = Js::Throw::ReportAssert
                      ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Common/Memory/Allocator.h"
                       ,0x1fb,"(ExceptionCheck::CanHandleOutOfMemory())",
                       "ExceptionCheck::CanHandleOutOfMemory()");
    if (!bVar4) goto LAB_00392903;
    *puVar7 = 0;
  }
  __s = (RecyclerWeakReferenceBase **)HeapAllocator::AllocT<false>(this_00,sVar8);
  uVar10 = 0;
  memset(__s,0,sVar8);
  if (__s == (RecyclerWeakReferenceBase **)0x0) {
    AssertCount = AssertCount + 1;
    Js::Throw::LogAssert();
    puVar7 = (undefined4 *)__tls_get_addr(&PTR_0155fe48);
    *puVar7 = 1;
    bVar4 = Js::Throw::ReportAssert
                      ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Common/Memory/Allocator.h"
                       ,0x1fe,"(buffer != nullptr)","buffer != nullptr");
    if (!bVar4) goto LAB_00392903;
    *puVar7 = 0;
  }
  sVar8 = (size_t)this->size;
  if (this->size != 0) {
    uVar9 = 0;
    uVar10 = 0;
    do {
      pRVar3 = this->buckets[uVar9];
      data._32_8_ = uVar9;
      while (pRVar3 != (RecyclerWeakReferenceBase *)0x0) {
        hVar6 = PrimePolicy::ModPrime
                          ((hash_t)((ulong)pRVar3->strongRef >> 4),newSize,this->modFunctionIndex);
        pRVar1 = pRVar3->next;
        pRVar3->next = __s[(int)hVar6];
        __s[(int)hVar6] = pRVar3;
        uVar10 = uVar10 + 1;
        pRVar3 = pRVar1;
      }
      uVar9 = data._32_8_ + 1;
      sVar8 = (size_t)this->size;
    } while (uVar9 < sVar8);
  }
  DeleteArray<Memory::HeapAllocator,Memory::RecyclerWeakReferenceBase*>
            (this->allocator,sVar8,this->buckets);
  this->size = newSize;
  this->buckets = __s;
  if (this->count != uVar10) {
    AssertCount = AssertCount + 1;
    Js::Throw::LogAssert();
    puVar7 = (undefined4 *)__tls_get_addr(&PTR_0155fe48);
    *puVar7 = 1;
    bVar4 = Js::Throw::ReportAssert
                      ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Common/Memory/RecyclerWeakReference.h"
                       ,0x14d,"(this->count == copiedEntries)","this->count == copiedEntries");
    if (!bVar4) {
LAB_00392903:
      pcVar2 = (code *)invalidInstructionException();
      (*pcVar2)();
    }
    *puVar7 = 0;
  }
  return;
}

Assistant:

void Resize(int newSize)
    {
#if DEBUG
        uint copiedEntries = 0;
#endif
        RecyclerWeakReferenceBase** newBuckets = AllocatorNewArrayZ(HeapAllocator, allocator, RecyclerWeakReferenceBase*, newSize);

        for (uint i=0; i < size; i++)
        {
            RecyclerWeakReferenceBase* current = buckets[i];
            while (current != nullptr)
            {
                int targetBucket = HashKeyToBucket(current->strongRef, newSize);
                RecyclerWeakReferenceBase* next = current->next; // Cache the next pointer

                AddEntry(current, &newBuckets[targetBucket]);
#if DEBUG
                copiedEntries++;
#endif
                current = next;
            }
        }

        AllocatorDeleteArray(HeapAllocator, allocator, size, buckets);
        size = newSize;
        buckets = newBuckets;
#if DEBUG
        Assert(this->count == copiedEntries);
#endif
    }